

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::Server::read_content
          (Server *this,Stream *strm,bool last_connection,Request *req,Response *res)

{
  bool bVar1;
  long lVar2;
  iterator cur;
  string local_98;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_78._M_unused._M_object = &cur;
  cur._M_node = (_Base_ptr)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/vladimirlisovskij[P]prog/Labs/Lab6/httplib.h:3100:7)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/vladimirlisovskij[P]prog/Labs/Lab6/httplib.h:3100:7)>
             ::_M_manager;
  local_40 = std::
             _Function_handler<bool_(const_httplib::MultipartFormData_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/vladimirlisovskij[P]prog/Labs/Lab6/httplib.h:3106:7)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(const_httplib::MultipartFormData_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/vladimirlisovskij[P]prog/Labs/Lab6/httplib.h:3106:7)>
             ::_M_manager;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/vladimirlisovskij[P]prog/Labs/Lab6/httplib.h:3110:7)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/vladimirlisovskij[P]prog/Labs/Lab6/httplib.h:3110:7)>
             ::_M_manager;
  local_58._M_unused._M_object = local_78._M_unused._M_object;
  local_58._8_8_ = req;
  local_38._M_unused._M_object = req;
  bVar1 = read_content_core(this,strm,last_connection,req,res,(ContentReceiver *)&local_38,
                            (MultipartContentHeader *)&local_58,(ContentReceiver *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  Request::get_header_value_abi_cxx11_(&local_98,req,"Content-Type",0);
  lVar2 = std::__cxx11::string::find((char *)&local_98,0x12fad6);
  if (lVar2 == 0) {
    detail::parse_query_text(&req->body,&req->params);
  }
  std::__cxx11::string::~string((string *)&local_98);
  return bVar1;
}

Assistant:

inline bool Server::read_content(Stream &strm, bool last_connection,
                                 Request &req, Response &res) {
  MultipartFormDataMap::iterator cur;
  auto ret = read_content_core(
      strm, last_connection, req, res,
      // Regular
      [&](const char *buf, size_t n) {
        if (req.body.size() + n > req.body.max_size()) { return false; }
        req.body.append(buf, n);
        return true;
      },
      // Multipart
      [&](const MultipartFormData &file) {
        cur = req.files.emplace(file.name, file);
        return true;
      },
      [&](const char *buf, size_t n) {
        auto &content = cur->second.content;
        if (content.size() + n > content.max_size()) { return false; }
        content.append(buf, n);
        return true;
      });

  const auto &content_type = req.get_header_value("Content-Type");
  if (!content_type.find("application/x-www-form-urlencoded")) {
    detail::parse_query_text(req.body, req.params);
  }

  return ret;
}